

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::sumOfHeights
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this)

{
  byte *in_RDI;
  uint i;
  ulint tot;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffff50;
  long local_70;
  uint local_1c;
  ulint local_18;
  ulint local_8;
  
  if ((in_RDI[0x80] & 1) == 0) {
    local_18 = 0;
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      std::
      vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
      ::operator[]((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                    *)(in_RDI + 0x38),(ulong)local_1c);
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info(in_stack_ffffffffffffff50);
      std::
      vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
      ::operator[]((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                    *)(in_RDI + 0x38),(ulong)local_1c);
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info(in_stack_ffffffffffffff50);
      local_18 = local_70 *
                 (long)((long)&(in_stack_ffffffffffffff50->_impl)._M_t.
                               super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                               .
                               super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                               ._M_head_impl + 1U) + local_18;
    }
    local_8 = local_18;
  }
  else {
    local_8 = *(ulint *)(in_RDI + 0x78);
  }
  return local_8;
}

Assistant:

ulint  sumOfHeights(){//sum of the heights of all bitvectors' B-trees (each multiplied by the length of the bitvector)

		if(unary_string)
			return n;

		ulint tot=0;

		for(uint i=0;i<number_of_internal_nodes;i++)
			//tot += wavelet_tree[i].maxSize()*wavelet_tree[i].height();
			tot += wavelet_tree[i].info().capacity * (wavelet_tree[i].info().height+1);//sum 1 because in bitvector heights start from 0

		return tot;

	}